

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igami.c
# Opt level: O2

double hcephes_igami(double a,double y0)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_80;
  double local_58;
  double local_48;
  double local_38;
  
  dVar9 = 1.0 / (a * 9.0);
  local_58 = 1.0;
  dVar6 = hcephes_ndtri(y0);
  local_48 = 0.0;
  if (dVar9 < 0.0) {
    dVar7 = sqrt(dVar9);
  }
  else {
    dVar7 = SQRT(dVar9);
  }
  dVar6 = (1.0 - dVar9) - dVar6 * dVar7;
  dVar6 = dVar6 * a * dVar6 * dVar6;
  dVar9 = hcephes_lgam(a);
  uVar3 = 0;
  local_80 = INFINITY;
  local_38 = 0.0;
  while ((((uVar3 < 10 && (dVar6 <= local_80)) && (local_48 <= dVar6)) &&
         ((dVar7 = hcephes_igamc(a,dVar6), local_38 <= dVar7 && (dVar7 <= local_58))))) {
    dVar8 = dVar6;
    dVar1 = dVar7;
    if (y0 <= dVar7) {
      dVar8 = local_80;
      local_58 = dVar7;
      dVar1 = local_38;
    }
    local_38 = dVar1;
    local_80 = dVar8;
    local_48 = (double)((ulong)local_48 & -(ulong)(dVar7 < y0) |
                       ~-(ulong)(dVar7 < y0) & (ulong)dVar6);
    dVar8 = log(dVar6);
    dVar8 = (dVar8 * (a + -1.0) - dVar6) - dVar9;
    if (dVar8 < -709.782712893384) break;
    dVar8 = exp(dVar8);
    dVar7 = (dVar7 - y0) / -dVar8;
    if (ABS(dVar7 / dVar6) < 1.1102230246251565e-16) {
      return dVar6;
    }
    dVar6 = dVar6 - dVar7;
    uVar3 = uVar3 + 1;
  }
  if (INFINITY <= local_80) {
    local_80 = (double)((ulong)dVar6 & -(ulong)(0.0 < dVar6) |
                       ~-(ulong)(0.0 < dVar6) & 0x3ff0000000000000);
    dVar9 = 0.0625;
    while( true ) {
      local_80 = (dVar9 + 1.0) * local_80;
      local_38 = hcephes_igamc(a,local_80);
      dVar6 = local_80;
      if (local_38 < y0) break;
      dVar9 = dVar9 + dVar9;
    }
  }
  uVar3 = 0;
  dVar9 = 0.5;
  iVar4 = 400;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    dVar6 = dVar9 * (local_80 - local_48) + local_48;
    dVar7 = hcephes_igamc(a,dVar6);
    if (((ABS((local_80 - local_48) / (local_48 + local_80)) < 5.551115123125783e-16) ||
        (dVar6 <= 0.0)) || (ABS((dVar7 - y0) / y0) < 5.551115123125783e-16)) break;
    if (y0 <= dVar7) {
      if ((int)uVar3 < 0) {
        uVar3 = 0;
        dVar9 = 0.5;
      }
      else if (uVar3 < 2) {
        dVar9 = (y0 - local_38) / (dVar7 - local_38);
      }
      else {
        dVar9 = dVar9 * 0.5 + 0.5;
      }
      uVar3 = uVar3 + 1;
      local_58 = dVar7;
      local_48 = dVar6;
    }
    else {
      uVar2 = 0;
      dVar8 = 0.5;
      if ((int)uVar3 < 1) {
        uVar2 = uVar3;
        if ((int)uVar3 < -1) {
          dVar8 = dVar9 * 0.5;
        }
        else {
          dVar8 = (y0 - dVar7) / (local_58 - dVar7);
        }
      }
      dVar9 = dVar8;
      uVar3 = uVar2 - 1;
      local_80 = dVar6;
      local_38 = dVar7;
    }
  }
  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
    hcephes_mtherr("igami",4);
  }
  return dVar6;
}

Assistant:

HCEPHES_API double hcephes_igami(double a, double y0) {
    double x0, x1, x, yl, yh, y, d, lgm, dithresh;
    int i, dir;

    /* bound the solution */
    x0 = HUGE_VAL;
    yl = 0;
    x1 = 0;
    yh = 1.0;
    dithresh = 5.0 * HCEPHES_MACHEP;

    /* approximation to inverse function */
    d = 1.0 / (9.0 * a);
    y = (1.0 - d - hcephes_ndtri(y0) * sqrt(d));
    x = a * y * y * y;

    lgm = hcephes_lgam(a);

    for (i = 0; i < 10; i++) {
        if (x > x0 || x < x1)
            goto ihalve;
        y = hcephes_igamc(a, x);
        if (y < yl || y > yh)
            goto ihalve;
        if (y < y0) {
            x0 = x;
            yl = y;
        } else {
            x1 = x;
            yh = y;
        }
        /* compute the derivative of the function at this point */
        d = (a - 1.0) * log(x) - x - lgm;
        if (d < -HCEPHES_MAXLOG)
            goto ihalve;
        d = -exp(d);
        /* compute the step to the next approximation of x */
        d = (y - y0) / d;
        if (fabs(d / x) < HCEPHES_MACHEP)
            goto done;
        x = x - d;
    }

/* Resort to interval halving if Newton iteration did not converge. */
ihalve:

    d = 0.0625;
    if (x0 == HUGE_VAL) {
        if (x <= 0.0)
            x = 1.0;
        while (x0 == HUGE_VAL) {
            x = (1.0 + d) * x;
            y = hcephes_igamc(a, x);
            if (y < y0) {
                x0 = x;
                yl = y;
                break;
            }
            d = d + d;
        }
    }
    d = 0.5;
    dir = 0;

    for (i = 0; i < 400; i++) {
        x = x1 + d * (x0 - x1);
        y = hcephes_igamc(a, x);
        lgm = (x0 - x1) / (x1 + x0);
        if (fabs(lgm) < dithresh)
            break;
        lgm = (y - y0) / y0;
        if (fabs(lgm) < dithresh)
            break;
        if (x <= 0.0)
            break;
        if (y >= y0) {
            x1 = x;
            yh = y;
            if (dir < 0) {
                dir = 0;
                d = 0.5;
            } else if (dir > 1)
                d = 0.5 * d + 0.5;
            else
                d = (y0 - yl) / (yh - yl);
            dir += 1;
        } else {
            x0 = x;
            yl = y;
            if (dir > 0) {
                dir = 0;
                d = 0.5;
            } else if (dir < -1)
                d = 0.5 * d;
            else
                d = (y0 - yl) / (yh - yl);
            dir -= 1;
        }
    }
    if (x == 0.0)
        hcephes_mtherr("igami", HCEPHES_UNDERFLOW);

done:
    return (x);
}